

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# squall_call.hpp
# Opt level: O3

void squall::detail::call_setup<Foo*>(HSQUIRRELVM vm,HSQOBJECT *table,string *name,Foo *args)

{
  bool bVar1;
  SQRESULT SVar2;
  KlassTable *this;
  runtime_error *prVar3;
  HSQOBJECT obj;
  HSQOBJECT obj_00;
  HSQOBJECT obj_01;
  HSQOBJECT sqo;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  obj._4_4_ = 0;
  obj._type = table->_type;
  obj._unVal.pTable = (table->_unVal).pTable;
  sq_pushobject(vm,obj);
  sq_pushstring(vm,(name->_M_dataplus)._M_p,name->_M_string_length);
  SVar2 = sq_get(vm,-2);
  if (SVar2 < 0) {
    prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_48,"can\'t find such function: ",name);
    std::runtime_error::runtime_error(prVar3,(string *)&local_48);
    *(undefined ***)prVar3 = &PTR__runtime_error_00141238;
    __cxa_throw(prVar3,&squirrel_error::typeinfo,std::runtime_error::~runtime_error);
  }
  sq_remove(vm,-2);
  obj_00._4_4_ = 0;
  obj_00._type = table->_type;
  obj_00._unVal.pTable = (table->_unVal).pTable;
  sq_pushobject(vm,obj_00);
  this = (KlassTable *)sq_getforeignptr(vm);
  bVar1 = KlassTable::find_klass_object<Foo>(this,(HSQOBJECT *)&local_48);
  if (bVar1) {
    obj_01._4_4_ = 0;
    obj_01._type = (uint)local_48._M_dataplus._M_p;
    obj_01._unVal = (SQObjectValue)local_48._M_string_length;
    sq_pushobject(vm,obj_01);
    sq_createinstance(vm,-1);
    sq_setinstanceup(vm,-1,args);
    sq_remove(vm,-2);
  }
  else {
    sq_pushuserpointer(vm,args);
  }
  SVar2 = sq_call(vm,2,1,1);
  if (-1 < SVar2) {
    return;
  }
  prVar3 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_48,"function call failed: ",name);
  std::runtime_error::runtime_error(prVar3,(string *)&local_48);
  *(undefined ***)prVar3 = &PTR__runtime_error_00141238;
  __cxa_throw(prVar3,&squirrel_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

inline
void call_setup(HSQUIRRELVM vm, const HSQOBJECT& table,
                const string& name, T... args) {

    sq_pushobject(vm, table);
    sq_pushstring(vm, name.data(), name.length());
    if (!SQ_SUCCEEDED(sq_get(vm, -2))) {
        throw squirrel_error(_SC("can't find such function: ") + name);
    }

    sq_remove(vm, -2);
    sq_pushobject(vm, table);
    call_setup_arg(vm, args...);
    if (!SQ_SUCCEEDED(sq_call(vm, sizeof...(args)+1, SQTrue, SQTrue))) {
        throw squirrel_error(_SC("function call failed: ") + name);
    }
}